

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlChar * xmlParseNmtoken(xmlParserCtxtPtr ctxt)

{
  xmlParserInputPtr pxVar1;
  int iVar2;
  int iVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  uint uVar6;
  size_t sVar7;
  uint len;
  uint uVar8;
  int l;
  uint local_ac;
  xmlChar buf [105];
  
  uVar6 = 10000000;
  if (((uint)ctxt->options >> 0x13 & 1) == 0) {
    uVar6 = 50000;
  }
  iVar2 = xmlCurrentChar(ctxt,&l);
  len = 0;
  do {
    iVar3 = xmlIsNameChar(ctxt,iVar2);
    if (iVar3 == 0) {
      if (len == 0) goto LAB_00133f75;
      pxVar4 = xmlStrndup(buf,len);
      if (pxVar4 != (xmlChar *)0x0) {
        return pxVar4;
      }
      goto LAB_00133f2f;
    }
    if (iVar2 < 0x80) {
      uVar8 = len + 1;
      buf[(int)len] = (xmlChar)iVar2;
    }
    else {
      iVar2 = xmlCopyCharMultiByte(buf + (int)len,iVar2);
      uVar8 = len + iVar2;
    }
    pxVar1 = ctxt->input;
    if (*pxVar1->cur == '\n') {
      pxVar1->line = pxVar1->line + 1;
      pxVar1->col = 1;
    }
    else {
      pxVar1->col = pxVar1->col + 1;
    }
    pxVar1->cur = pxVar1->cur + l;
    iVar2 = xmlCurrentChar(ctxt,&l);
    len = uVar8;
  } while ((int)uVar8 < 100);
  sVar7 = (size_t)(uVar8 * 2);
  pxVar4 = (xmlChar *)(*xmlMalloc)(sVar7);
  if (pxVar4 == (xmlChar *)0x0) {
LAB_00133f2f:
    xmlCtxtErrMemory(ctxt);
LAB_00133f75:
    pxVar4 = (xmlChar *)0x0;
  }
  else {
    local_ac = uVar6;
    memcpy(pxVar4,buf,(ulong)uVar8);
    while( true ) {
      iVar3 = xmlIsNameChar(ctxt,iVar2);
      if (iVar3 == 0) break;
      iVar3 = (int)sVar7;
      pxVar5 = pxVar4;
      if (iVar3 < (int)(uVar8 + 10)) {
        sVar7 = 1;
        if (iVar3 < 1) {
LAB_00133e94:
          pxVar5 = (xmlChar *)(*xmlRealloc)(pxVar4,sVar7);
          if (pxVar5 != (xmlChar *)0x0) goto LAB_00133eb5;
          xmlCtxtErrMemory(ctxt);
        }
        else {
          if (iVar3 < (int)local_ac) {
            uVar6 = iVar3 + 1U >> 1;
            sVar7 = (size_t)(uVar6 + iVar3);
            if ((int)(local_ac - uVar6) < iVar3) {
              sVar7 = (size_t)local_ac;
            }
            goto LAB_00133e94;
          }
          xmlFatalErr(ctxt,XML_ERR_NAME_TOO_LONG,"NmToken");
        }
        (*xmlFree)(pxVar4);
        goto LAB_00133f75;
      }
LAB_00133eb5:
      if (iVar2 < 0x80) {
        pxVar5[(int)uVar8] = (xmlChar)iVar2;
        uVar8 = uVar8 + 1;
      }
      else {
        iVar2 = xmlCopyCharMultiByte(pxVar5 + (int)uVar8,iVar2);
        uVar8 = iVar2 + uVar8;
      }
      pxVar1 = ctxt->input;
      if (*pxVar1->cur == '\n') {
        pxVar1->line = pxVar1->line + 1;
        pxVar1->col = 1;
      }
      else {
        pxVar1->col = pxVar1->col + 1;
      }
      pxVar1->cur = pxVar1->cur + l;
      iVar2 = xmlCurrentChar(ctxt,&l);
      pxVar4 = pxVar5;
    }
    pxVar4[(int)uVar8] = '\0';
  }
  return pxVar4;
}

Assistant:

xmlChar *
xmlParseNmtoken(xmlParserCtxtPtr ctxt) {
    xmlChar buf[XML_MAX_NAMELEN + 5];
    xmlChar *ret;
    int len = 0, l;
    int c;
    int maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                    XML_MAX_TEXT_LENGTH :
                    XML_MAX_NAME_LENGTH;

    c = xmlCurrentChar(ctxt, &l);

    while (xmlIsNameChar(ctxt, c)) {
	COPY_BUF(buf, len, c);
	NEXTL(l);
	c = xmlCurrentChar(ctxt, &l);
	if (len >= XML_MAX_NAMELEN) {
	    /*
	     * Okay someone managed to make a huge token, so he's ready to pay
	     * for the processing speed.
	     */
	    xmlChar *buffer;
	    int max = len * 2;

	    buffer = xmlMalloc(max);
	    if (buffer == NULL) {
	        xmlErrMemory(ctxt);
		return(NULL);
	    }
	    memcpy(buffer, buf, len);
	    while (xmlIsNameChar(ctxt, c)) {
		if (len + 10 > max) {
		    xmlChar *tmp;
                    int newSize;

                    newSize = xmlGrowCapacity(max, 1, 1, maxLength);
                    if (newSize < 0) {
                        xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "NmToken");
                        xmlFree(buffer);
                        return(NULL);
                    }
		    tmp = xmlRealloc(buffer, newSize);
		    if (tmp == NULL) {
			xmlErrMemory(ctxt);
			xmlFree(buffer);
			return(NULL);
		    }
		    buffer = tmp;
                    max = newSize;
		}
		COPY_BUF(buffer, len, c);
		NEXTL(l);
		c = xmlCurrentChar(ctxt, &l);
	    }
	    buffer[len] = 0;
	    return(buffer);
	}
    }
    if (len == 0)
        return(NULL);
    if (len > maxLength) {
        xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "NmToken");
        return(NULL);
    }
    ret = xmlStrndup(buf, len);
    if (ret == NULL)
        xmlErrMemory(ctxt);
    return(ret);
}